

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamIOException.hpp
# Opt level: O1

void __thiscall
antlr::TokenStreamIOException::TokenStreamIOException(TokenStreamIOException *this,exception *e)

{
  char *__s;
  allocator<char> local_31;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__ANTLRException_00305200;
  (this->super_TokenStreamException).super_ANTLRException.text._M_dataplus._M_p =
       (pointer)&(this->super_TokenStreamException).super_ANTLRException.text.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_TokenStreamException).super_ANTLRException.text,local_30,
             local_28 + (long)local_30);
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__ANTLRException_00305e58;
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamIOException_00305e88;
  *(code **)&this->io = getenv;
  return;
}

Assistant:

TokenStreamIOException(const ANTLR_USE_NAMESPACE(std)exception& e)
	: TokenStreamException(e.what())
	, io(e)
	{
	}